

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Expression * __thiscall
wasm::TranslateToFuzzReader::makeAtomic(TranslateToFuzzReader *this,Type type)

{
  Random *this_00;
  int8_t iVar1;
  bool bVar2;
  BasicType BVar3;
  uint32_t uVar4;
  Index IVar5;
  AtomicRMWOp op;
  AtomicFence *pAVar6;
  AtomicNotify *pAVar7;
  Expression *pEVar8;
  Expression *pEVar9;
  AtomicCmpxchg *pAVar10;
  Expression *replacement;
  Address offset;
  Address offset_00;
  Address offset_01;
  Expression *value;
  Type local_40;
  Type type_local;
  
  local_40.id = type.id;
  if (((byte)this->wasm[0x108] & 1) == 0) {
    __assert_fail("wasm.features.hasAtomics()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0xb14,"Expression *wasm::TranslateToFuzzReader::makeAtomic(Type)");
  }
  if (this->allowMemory == false) {
    pEVar8 = makeTrivial(this,type);
    return pEVar8;
  }
  *(undefined1 *)(**(long **)(this->wasm + 0x78) + 0x48) = 1;
  if (type.id == 2) {
    bVar2 = Random::oneIn(&this->random,2);
    if (bVar2) {
      pEVar8 = makePointer(this);
      pEVar9 = make(this,(Type)0x2);
      iVar1 = Random::get(&this->random);
      IVar5 = logify(this,(int)iVar1);
      offset.addr._4_4_ = 0;
      offset.addr._0_4_ = IVar5;
      pAVar7 = Builder::makeAtomicNotify
                         (&this->builder,pEVar8,pEVar9,offset,
                          (Name)((IString *)**(undefined8 **)(this->wasm + 0x78))->str);
      return (Expression *)pAVar7;
    }
  }
  else if (type.id == 0) {
    pAVar6 = Builder::makeAtomicFence(&this->builder);
    return (Expression *)pAVar6;
  }
  BVar3 = Type::getBasic(&local_40);
  if (BVar3 != i64) {
    if (BVar3 != i32) {
      wasm::handle_unreachable
                ("unexpected type",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                 ,0xb55);
    }
    uVar4 = Random::upTo(&this->random,3);
    if (uVar4 == 0) {
switchD_00133f3e_caseD_0:
      type_local.id._4_4_ = 1;
    }
    else {
      if (uVar4 == 2) goto switchD_00133f3e_caseD_2;
      if (uVar4 != 1) {
        wasm::handle_unreachable
                  ("invalide value",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                   ,0xb3d);
      }
switchD_00133f3e_caseD_1:
      type_local.id._4_4_ = Random::pick<int,int>(&this->random,1,2);
    }
LAB_00133f7d:
    this_00 = &this->random;
    iVar1 = Random::get(this_00);
    IVar5 = logify(this,(int)iVar1);
    pEVar8 = makePointer(this);
    bVar2 = Random::oneIn(this_00,2);
    pEVar9 = make(this,local_40);
    if (bVar2) {
      op = Random::
           pick<wasm::AtomicRMWOp,wasm::AtomicRMWOp,wasm::AtomicRMWOp,wasm::AtomicRMWOp,wasm::AtomicRMWOp,wasm::AtomicRMWOp>
                     (this_00,RMWAdd,RMWSub,RMWAnd,RMWOr,RMWXor,RMWXchg);
      offset_00.addr._4_4_ = 0;
      offset_00.addr._0_4_ = IVar5;
      pAVar10 = (AtomicCmpxchg *)
                Builder::makeAtomicRMW
                          (&this->builder,op,type_local.id._4_4_,offset_00,pEVar8,pEVar9,local_40,
                           (Name)((IString *)**(undefined8 **)(this->wasm + 0x78))->str);
    }
    else {
      replacement = make(this,local_40);
      offset_01.addr._4_4_ = 0;
      offset_01.addr._0_4_ = IVar5;
      pAVar10 = Builder::makeAtomicCmpxchg
                          (&this->builder,type_local.id._4_4_,offset_01,pEVar8,pEVar9,replacement,
                           local_40,(Name)((IString *)**(undefined8 **)(this->wasm + 0x78))->str);
    }
    return (Expression *)pAVar10;
  }
  uVar4 = Random::upTo(&this->random,4);
  switch(uVar4) {
  case 0:
    goto switchD_00133f3e_caseD_0;
  case 1:
    goto switchD_00133f3e_caseD_1;
  case 2:
switchD_00133f3e_caseD_2:
    type_local.id._4_4_ = Random::pick<int,int,int>(&this->random,1,2,4);
    goto LAB_00133f7d;
  case 3:
    type_local.id._4_4_ = Random::pick<int,int,int,int>(&this->random,1,2,4,8);
    goto LAB_00133f7d;
  default:
    wasm::handle_unreachable
              ("invalide value",
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
               ,0xb50);
  }
}

Assistant:

Expression* TranslateToFuzzReader::makeAtomic(Type type) {
  assert(wasm.features.hasAtomics());
  if (!allowMemory) {
    return makeTrivial(type);
  }
  wasm.memories[0]->shared = true;
  if (type == Type::none) {
    return builder.makeAtomicFence();
  }
  if (type == Type::i32 && oneIn(2)) {
    if (ATOMIC_WAITS && oneIn(2)) {
      auto* ptr = makePointer();
      auto expectedType = pick(Type::i32, Type::i64);
      auto* expected = make(expectedType);
      auto* timeout = make(Type::i64);
      return builder.makeAtomicWait(ptr,
                                    expected,
                                    timeout,
                                    expectedType,
                                    logify(get()),
                                    wasm.memories[0]->name);
    } else {
      auto* ptr = makePointer();
      auto* count = make(Type::i32);
      return builder.makeAtomicNotify(
        ptr, count, logify(get()), wasm.memories[0]->name);
    }
  }
  Index bytes;
  switch (type.getBasic()) {
    case Type::i32: {
      switch (upTo(3)) {
        case 0:
          bytes = 1;
          break;
        case 1:
          bytes = pick(1, 2);
          break;
        case 2:
          bytes = pick(1, 2, 4);
          break;
        default:
          WASM_UNREACHABLE("invalide value");
      }
      break;
    }
    case Type::i64: {
      switch (upTo(4)) {
        case 0:
          bytes = 1;
          break;
        case 1:
          bytes = pick(1, 2);
          break;
        case 2:
          bytes = pick(1, 2, 4);
          break;
        case 3:
          bytes = pick(1, 2, 4, 8);
          break;
        default:
          WASM_UNREACHABLE("invalide value");
      }
      break;
    }
    default:
      WASM_UNREACHABLE("unexpected type");
  }
  auto offset = logify(get());
  auto* ptr = makePointer();
  if (oneIn(2)) {
    auto* value = make(type);
    return builder.makeAtomicRMW(
      pick(RMWAdd, RMWSub, RMWAnd, RMWOr, RMWXor, RMWXchg),
      bytes,
      offset,
      ptr,
      value,
      type,
      wasm.memories[0]->name);
  } else {
    auto* expected = make(type);
    auto* replacement = make(type);
    return builder.makeAtomicCmpxchg(
      bytes, offset, ptr, expected, replacement, type, wasm.memories[0]->name);
  }
}